

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

bool __thiscall glslang::TType::sameCoopMatShape(TType *this,TType *right)

{
  TVector<glslang::TArraySize> *pTVar1;
  uint uVar2;
  uint uVar3;
  int i;
  uint i_00;
  int iVar4;
  bool bVar5;
  
  uVar2 = *(uint *)&this->field_0x8;
  if (((uVar2 & 0x600000) == 0) || ((*(uint *)&right->field_0x8 & 0x600000) == 0)) {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    iVar4 = 0;
    if (((*(uint *)&right->field_0x8 ^ uVar2) >> 0x16 & 1) == 0) {
      pTVar1 = (this->typeParameters->arraySizes->sizes).sizes;
      if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
        iVar4 = (int)((ulong)((long)(pTVar1->
                                    super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ).
                                    super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar1->
                                   super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ).
                                   super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
      }
      i_00 = uVar2 >> 0x15 & 1;
      iVar4 = iVar4 - (uint)((uVar2 >> 0x16 & 1) != 0);
      do {
        bVar5 = iVar4 <= (int)i_00;
        if (iVar4 <= (int)i_00) {
          return bVar5;
        }
        uVar2 = TSmallArrayVector::getDimSize(&this->typeParameters->arraySizes->sizes,i_00);
        uVar3 = TSmallArrayVector::getDimSize(&right->typeParameters->arraySizes->sizes,i_00);
        i_00 = i_00 + 1;
      } while (uVar2 == uVar3);
    }
  }
  return bVar5;
}

Assistant:

bool isCoopMat() const { return coopmatNV || coopmatKHR; }